

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileOptions::MergePartialFromCodedStream
          (FileOptions *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  InternalMetadataWithArena *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  byte *pbVar1;
  ArenaStringPtr *this_04;
  ArenaStringPtr *this_05;
  ArenaStringPtr *this_06;
  ArenaStringPtr *this_07;
  byte bVar2;
  uint8 uVar3;
  byte *pbVar4;
  void *pvVar5;
  uint8 *puVar6;
  uint uVar7;
  ExtensionSet *pEVar8;
  bool bVar9;
  uint32 uVar10;
  Type *this_08;
  pair<int,_int> pVar11;
  ExtensionSet *pEVar12;
  char *field_name;
  int iVar13;
  pointer data;
  UnknownFieldSet *pUVar14;
  char cVar15;
  uint uVar16;
  ulong uVar17;
  pair<unsigned_long,_bool> pVar18;
  pair<unsigned_long,_bool> pVar19;
  pair<unsigned_long,_bool> pVar20;
  pair<unsigned_long,_bool> pVar21;
  pair<unsigned_long,_bool> pVar22;
  pair<unsigned_long,_bool> pVar23;
  pair<unsigned_long,_bool> pVar24;
  ExtensionSet *local_60;
  
  this_04 = &this->php_class_prefix_;
  this_05 = &this->swift_prefix_;
  this_06 = &this->csharp_namespace_;
  this_07 = &this->objc_class_prefix_;
  this_00 = &this->go_package_;
  this_01 = &this->_internal_metadata_;
  this_02 = &this->java_outer_classname_;
  this_03 = &this->java_package_;
  local_60 = &this->_extensions_;
  do {
    pbVar4 = input->buffer_;
    uVar10 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar10 = (uint32)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar16 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar16) < 0x80)) goto LAB_001fd814;
        uVar16 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar17 = (ulong)uVar16 | 0x100000000;
    }
    else {
LAB_001fd814:
      uVar10 = io::CodedInputStream::ReadTagFallback(input,uVar10);
      uVar17 = 0;
      if (uVar10 - 1 < 0x3fff) {
        uVar17 = 0x100000000;
      }
      uVar17 = uVar10 | uVar17;
    }
    uVar16 = (uint)uVar17;
    if ((uVar17 & 0x100000000) == 0) goto switchD_001fd06e_caseD_2;
    uVar7 = (uint)(uVar17 >> 3) & 0x1fffffff;
    cVar15 = (char)uVar17;
    switch(uVar7) {
    case 1:
      if (cVar15 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if ((this->java_package_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
      {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_03,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar9 = internal::WireFormatLite::ReadBytes(input,this_03->ptr_);
      if (bVar9) {
        data = (this_03->ptr_->_M_dataplus)._M_p;
        iVar13 = (int)this_03->ptr_->_M_string_length;
        field_name = "google.protobuf.FileOptions.java_package";
LAB_001fd387:
        internal::WireFormatLite::VerifyUtf8String(data,iVar13,PARSE,field_name);
        goto LAB_001fd62a;
      }
LAB_001fd80c:
      cVar15 = '\x06';
      goto LAB_001fd62c;
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x13:
    case 0x15:
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x26:
      break;
    case 8:
      if (cVar15 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if ((this->java_outer_classname_).ptr_ ==
            (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_02,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar9 = internal::WireFormatLite::ReadBytes(input,this_02->ptr_);
        if (bVar9) {
          data = (this_02->ptr_->_M_dataplus)._M_p;
          iVar13 = (int)this_02->ptr_->_M_string_length;
          field_name = "google.protobuf.FileOptions.java_outer_classname";
          goto LAB_001fd387;
        }
        goto LAB_001fd80c;
      }
      break;
    case 9:
      if (cVar15 == 'H') {
        pbVar4 = input->buffer_;
        if (pbVar4 < input->buffer_end_) {
          bVar2 = *pbVar4;
          pEVar12 = (ExtensionSet *)(ulong)bVar2;
          uVar10 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_001fd8c3;
          input->buffer_ = pbVar4 + 1;
          bVar9 = true;
        }
        else {
          uVar10 = 0;
LAB_001fd8c3:
          pEVar12 = (ExtensionSet *)io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
          bVar9 = -1 < (long)pEVar12;
        }
        cVar15 = '\x06';
        pEVar8 = local_60;
        if (bVar9) {
          pEVar8 = pEVar12;
        }
        local_60 = (ExtensionSet *)((ulong)pEVar8 & 0xffffffff);
        if (bVar9) {
          iVar13 = (int)pEVar8;
          if (iVar13 - 1U < 3) {
            pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
            *pbVar4 = *pbVar4 | 0x80;
            this->optimize_for_ = iVar13;
            cVar15 = '\0';
          }
          else {
            pvVar5 = (this_01->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar5 & 1) == 0) {
              pUVar14 = internal::
                        InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        ::mutable_unknown_fields_slow
                                  (&this_01->
                                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                  );
            }
            else {
              pUVar14 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
            }
            UnknownFieldSet::AddVarint(pUVar14,9,(long)iVar13);
            cVar15 = '\0';
          }
        }
        if (bVar9) goto LAB_001fd62a;
        goto LAB_001fd62c;
      }
      break;
    case 10:
      if (cVar15 == 'P') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar19._8_8_ = 1;
          pVar19.first = (long)(char)uVar3;
        }
        else {
          pVar19 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->java_multiple_files_ = pVar19.first != 0;
          goto LAB_001fd62a;
        }
LAB_001fd7e0:
        cVar15 = '\x06';
        goto LAB_001fd62c;
      }
      break;
    case 0xb:
      if (cVar15 != 'Z') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      if ((this->go_package_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar9 = internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
      if (!bVar9) {
        cVar15 = '\x06';
        goto LAB_001fd62c;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileOptions.go_package");
      goto LAB_001fd62a;
    case 0x10:
      break;
    case 0x11:
      if (cVar15 == -0x78) {
        pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar4 = *pbVar4 | 8;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar23._8_8_ = 1;
          pVar23.first = (long)(char)uVar3;
        }
        else {
          pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001fd7e0;
        this->java_generic_services_ = pVar23.first != 0;
        goto LAB_001fd62a;
      }
      break;
    case 0x12:
      if (cVar15 == -0x70) {
        pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar4 = *pbVar4 | 0x10;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar20._8_8_ = 1;
          pVar20.first = (long)(char)uVar3;
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001fd7e0;
        this->py_generic_services_ = pVar20.first != 0;
        goto LAB_001fd62a;
      }
      break;
    case 0x14:
      if (cVar15 == -0x60) {
        pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar4 = *pbVar4 | 1;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar24._8_8_ = 1;
          pVar24.first = (long)(char)uVar3;
        }
        else {
          pVar24 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001fd7e0;
        this->java_generate_equals_and_hash_ = pVar24.first != 0;
        goto LAB_001fd62a;
      }
      break;
    case 0x17:
      if (cVar15 == -0x48) {
        pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar4 = *pbVar4 | 0x20;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar18._8_8_ = 1;
          pVar18.first = (long)(char)uVar3;
        }
        else {
          pVar18 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001fd7e0;
        this->deprecated_ = pVar18.first != 0;
        goto LAB_001fd62a;
      }
      break;
    case 0x1b:
      if (cVar15 == -0x28) {
        pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar4 = *pbVar4 | 2;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar21._8_8_ = 1;
          pVar21.first = (long)(char)uVar3;
        }
        else {
          pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001fd7e0;
        this->java_string_check_utf8_ = pVar21.first != 0;
        goto LAB_001fd62a;
      }
      break;
    case 0x1f:
      if (cVar15 == -8) {
        pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar4 = *pbVar4 | 0x40;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar22._8_8_ = 1;
          pVar22.first = (long)(char)uVar3;
        }
        else {
          pVar22 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001fd7e0;
        this->cc_enable_arenas_ = pVar22.first != 0;
        goto LAB_001fd62a;
      }
      break;
    case 0x24:
      if (cVar15 == '\"') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        if ((this->objc_class_prefix_).ptr_ ==
            (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_07,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar9 = internal::WireFormatLite::ReadBytes(input,this_07->ptr_);
        if (!bVar9) {
          cVar15 = '\x06';
          goto LAB_001fd62c;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_07->ptr_->_M_dataplus)._M_p,(int)this_07->ptr_->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.objc_class_prefix");
        goto LAB_001fd62a;
      }
      break;
    case 0x25:
      if (cVar15 == '*') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        if ((this->csharp_namespace_).ptr_ ==
            (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_06,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar9 = internal::WireFormatLite::ReadBytes(input,this_06->ptr_);
        if (!bVar9) {
          cVar15 = '\x06';
          goto LAB_001fd62c;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_06->ptr_->_M_dataplus)._M_p,(int)this_06->ptr_->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.csharp_namespace");
        goto LAB_001fd62a;
      }
      break;
    case 0x27:
      if (cVar15 == ':') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        if ((this->swift_prefix_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_
           ) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_05,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar9 = internal::WireFormatLite::ReadBytes(input,this_05->ptr_);
        if (!bVar9) {
          cVar15 = '\x06';
          goto LAB_001fd62c;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_05->ptr_->_M_dataplus)._M_p,(int)this_05->ptr_->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.swift_prefix");
        goto LAB_001fd62a;
      }
      break;
    case 0x28:
      if (cVar15 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
        if ((this->php_class_prefix_).ptr_ ==
            (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_04,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar9 = internal::WireFormatLite::ReadBytes(input,this_04->ptr_);
        if (!bVar9) {
          cVar15 = '\x06';
          goto LAB_001fd62c;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_04->ptr_->_M_dataplus)._M_p,(int)this_04->ptr_->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.php_class_prefix");
        goto LAB_001fd62a;
      }
      break;
    default:
      if ((uVar7 != 999) || (cVar15 != ':')) break;
      this_08 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (iVar13 = (int)(char)*puVar6, -1 < (char)*puVar6)) {
        input->buffer_ = puVar6 + 1;
        bVar9 = true;
      }
      else {
        iVar13 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar9 = -1 < iVar13;
      }
      if (((!bVar9) ||
          (pVar11 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar13),
          (long)pVar11 < 0)) ||
         (bVar9 = UninterpretedOption::MergePartialFromCodedStream(this_08,input), !bVar9))
      goto LAB_001fd80c;
      bVar9 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar11.first);
      goto LAB_001fd141;
    }
switchD_001fd06e_caseD_2:
    if ((uVar16 & 7) == 4 || uVar16 == 0) {
      cVar15 = '\a';
    }
    else if (uVar16 < 8000) {
      pvVar5 = (this_01->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_;
      if (((ulong)pvVar5 & 1) == 0) {
        pUVar14 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            (&this_01->
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            );
      }
      else {
        pUVar14 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
      }
      bVar9 = internal::WireFormat::SkipField(input,uVar16,pUVar14);
LAB_001fd141:
      cVar15 = '\x06';
      if (bVar9 != false) {
LAB_001fd62a:
        cVar15 = '\0';
      }
    }
    else {
      pvVar5 = (this_01->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_;
      if (((ulong)pvVar5 & 1) == 0) {
        pUVar14 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            (&this_01->
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            );
      }
      else {
        pUVar14 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
      }
      bVar9 = internal::ExtensionSet::ParseField
                        (&this->_extensions_,uVar16,input,(Message *)&_FileOptions_default_instance_
                         ,pUVar14);
      cVar15 = !bVar9 * '\x03' + '\x03';
    }
LAB_001fd62c:
    if ((cVar15 != '\0') && (cVar15 != '\x03')) {
      return cVar15 != '\x06';
    }
  } while( true );
}

Assistant:

bool FileOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FileOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string java_package = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->java_package().data(), this->java_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.java_package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string java_outer_classname = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_outer_classname()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->java_outer_classname().data(), this->java_outer_classname().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.java_outer_classname");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FileOptions_OptimizeMode_IsValid(value)) {
            set_optimize_for(static_cast< ::google::protobuf::FileOptions_OptimizeMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(9, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_multiple_files = 10 [default = false];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_java_multiple_files();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_multiple_files_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string go_package = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_go_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->go_package().data(), this->go_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.go_package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cc_generic_services = 16 [default = false];
      case 16: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(128u)) {
          set_has_cc_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_generic_services = 17 [default = false];
      case 17: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(136u)) {
          set_has_java_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool py_generic_services = 18 [default = false];
      case 18: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(144u)) {
          set_has_py_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &py_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {
          set_has_java_generate_equals_and_hash();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generate_equals_and_hash_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 23 [default = false];
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(184u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_string_check_utf8 = 27 [default = false];
      case 27: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(216u)) {
          set_has_java_string_check_utf8();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_string_check_utf8_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cc_enable_arenas = 31 [default = false];
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(248u)) {
          set_has_cc_enable_arenas();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_enable_arenas_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string objc_class_prefix = 36;
      case 36: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(290u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_objc_class_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->objc_class_prefix().data(), this->objc_class_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.objc_class_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string csharp_namespace = 37;
      case 37: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(298u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_csharp_namespace()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->csharp_namespace().data(), this->csharp_namespace().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.csharp_namespace");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string swift_prefix = 39;
      case 39: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(314u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_swift_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->swift_prefix().data(), this->swift_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.swift_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string php_class_prefix = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_php_class_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->php_class_prefix().data(), this->php_class_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.php_class_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FileOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FileOptions)
  return false;
#undef DO_
}